

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simul.cpp
# Opt level: O0

Simulation * MetaSim::Simulation::getInstance(void)

{
  Simulation *pSVar1;
  Simulation *unaff_retaddr;
  
  if (instance_ == (Simulation *)0x0) {
    pSVar1 = (Simulation *)operator_new(0x80);
    Simulation(unaff_retaddr);
    instance_ = pSVar1;
  }
  return instance_;
}

Assistant:

Simulation& Simulation::getInstance()
    {
        if (instance_ == 0) instance_ = new Simulation();
                
        return *instance_;
    }